

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32Interface.cpp
# Opt level: O1

int connectssc32interface(RS232PORT *pSSC32InterfacePseudoRS232Port)

{
  int iVar1;
  
  iVar1 = OpenRS232Port(pSSC32InterfacePseudoRS232Port,szSSC32InterfacePath);
  if (iVar1 != 0) {
    puts("Unable to connect to a SSC32Interface.");
    return 1;
  }
  if (3 < pSSC32InterfacePseudoRS232Port->DevType - 1U) {
    if ((pSSC32InterfacePseudoRS232Port->DevType != 0) ||
       (iVar1 = SetOptionsComputerRS232Port
                          (pSSC32InterfacePseudoRS232Port->hDev,SSC32InterfaceBaudRate,'\0',0,'\b',
                           '\0',SSC32InterfaceTimeout), iVar1 != 0)) {
      puts("Unable to connect to a SSC32Interface.");
      CloseRS232Port(pSSC32InterfacePseudoRS232Port);
      return 1;
    }
    tcflush(*(int *)&pSSC32InterfacePseudoRS232Port->hDev,2);
  }
  puts("SSC32Interface connected.");
  return 0;
}

Assistant:

int connectssc32interface(RS232PORT* pSSC32InterfacePseudoRS232Port)
{
	if (OpenRS232Port(pSSC32InterfacePseudoRS232Port, szSSC32InterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a SSC32Interface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pSSC32InterfacePseudoRS232Port, SSC32InterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)SSC32InterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a SSC32Interface.\n");
		CloseRS232Port(pSSC32InterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("SSC32Interface connected.\n");

	return EXIT_SUCCESS;
}